

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O0

int poptSaneFile(char *fn)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_a8 [8];
  stat sb;
  char *fn_local;
  
  if (((fn == (char *)0x0) ||
      (sb.__glibc_reserved[2] = (__syscall_slong_t)fn, pcVar2 = strstr(fn,".rpmnew"),
      pcVar2 != (char *)0x0)) ||
     (pcVar2 = strstr((char *)sb.__glibc_reserved[2],".rpmsave"), pcVar2 != (char *)0x0)) {
    return 0;
  }
  iVar1 = stat((char *)sb.__glibc_reserved[2],(stat *)local_a8);
  if (iVar1 == -1) {
    return 0;
  }
  if (((uint)sb.st_nlink & 0xf000) != 0x8000) {
    return 0;
  }
  if (((uint)sb.st_nlink & 0x49) != 0) {
    return 0;
  }
  return 1;
}

Assistant:

int poptSaneFile(const char * fn)
{
    struct stat sb;

    if (fn == NULL || strstr(fn, ".rpmnew") || strstr(fn, ".rpmsave"))
	return 0;
    if (stat(fn, &sb) == -1)
	return 0;
    if (!S_ISREG(sb.st_mode))
	return 0;
    if (sb.st_mode & (S_IXUSR|S_IXGRP|S_IXOTH))
	return 0;
    return 1;
}